

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

uint16_t parse_ncname(ly_ctx *ctx,char *ncname)

{
  uint uVar1;
  uint uVar2;
  uint16_t uVar3;
  uint local_2c [2];
  uint size;
  
  uVar1 = lyxml_getutf8(ctx,ncname,local_2c);
  if (uVar1 == 0x5f || uVar1 - 0x61 < 0x1a) {
LAB_0016d51f:
    uVar1 = 0;
    do {
      do {
        while( true ) {
          do {
            uVar1 = uVar1 + local_2c[0];
            uVar3 = (uint16_t)uVar1;
            if (ncname[uVar1 & 0xffff] == '\0') {
              return uVar3;
            }
            uVar2 = lyxml_getutf8(ctx,ncname + (uVar1 & 0xffff),local_2c);
          } while (((uVar2 - 0x61 < 0x1a) || (uVar2 == 0x2d)) || (uVar2 == 0x5f));
          if (10 < uVar2 - 0x30 && 0x19 < uVar2 - 0x41) break;
LAB_0016d56e:
          if (uVar2 == 0x3a) {
            return uVar3;
          }
        }
      } while (((uVar2 == 0x2e) || (uVar2 == 0xb7)) || (uVar2 != 0x37e && uVar2 - 0x370 < 0x1c90));
      if ((((uVar2 - 0xfdf0 < 0x20e) || (uVar2 - 0xf900 < 0x4d0)) ||
          ((uVar2 - 0x3001 < 0xa7ff || ((uVar2 - 0x2c00 < 0x3f0 || (uVar2 - 0x2070 < 0x120)))))) ||
         ((uVar2 - 0x300 < 0x70 ||
          (((uVar2 & 0xfffffffe) == 0x200c || (uVar2 - 0xc0 < 0x240 && (uVar2 & 0xffffffdf) != 0xd7)
           ))))) goto LAB_0016d56e;
    } while (uVar2 - 0x10000 < 0xe0000);
  }
  else {
    if (uVar1 == 0x3a || uVar1 - 0x41 < 0x1a) {
LAB_0016d44c:
      if (uVar1 != 0x3a) goto LAB_0016d51f;
    }
    else {
      if (uVar1 != 0x37e && uVar1 - 0x370 < 0x1c90) goto LAB_0016d51f;
      if (((((uVar1 - 0xfdf0 < 0x20e) || (uVar1 - 0xf900 < 0x4d0)) || (uVar1 - 0x3001 < 0xa7ff)) ||
          ((uVar1 - 0x2c00 < 0x3f0 || (uVar1 - 0x2070 < 0x120)))) ||
         (((uVar1 & 0xfffffffe) == 0x200c || (uVar1 - 0xc0 < 0x240 && (uVar1 & 0xffffffdf) != 0xd7))
         )) goto LAB_0016d44c;
      if (0xfff1ffff < uVar1 - 0xf0000) goto LAB_0016d51f;
    }
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static uint16_t
parse_ncname(struct ly_ctx *ctx, const char *ncname)
{
    uint16_t parsed = 0;
    int uc;
    unsigned int size;

    uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    if (!is_xmlnamestartchar(uc) || (uc == ':')) {
       return parsed;
    }

    do {
        parsed += size;
        if (!ncname[parsed]) {
            break;
        }
        uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    } while (is_xmlnamechar(uc) && (uc != ':'));

    return parsed;
}